

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

void __thiscall
wallet::coinselector_tests::knapsack_solver_test::test_method(knapsack_solver_test *this)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *pvVar6;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar7;
  CAmount CVar8;
  int iVar9;
  iterator in_R8;
  iterator pvVar10;
  FastRandomContext *pFVar11;
  iterator in_R9;
  iterator pvVar12;
  short sVar13;
  int iVar14;
  long in_FS_OFFSET;
  double dVar15;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  const_string file_76;
  const_string file_77;
  const_string file_78;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  const_string msg_78;
  check_type cVar16;
  int in_stack_ffffffffffffe718;
  undefined1 *local_18e0;
  undefined1 *local_18d8;
  char *local_18d0;
  char *local_18c8;
  char *local_18c0;
  char *local_18b8;
  undefined1 *local_18b0;
  undefined1 *local_18a8;
  char *local_18a0;
  char *local_1898;
  char *local_1890;
  char *local_1888;
  undefined1 *local_1880;
  undefined1 *local_1878;
  char *local_1870;
  char *local_1868;
  undefined1 *local_1860;
  undefined1 *local_1858;
  char *local_1850;
  char *local_1848;
  char *local_1840;
  char *local_1838;
  undefined1 *local_1830;
  undefined1 *local_1828;
  char *local_1820;
  char *local_1818;
  char *local_1810;
  char *local_1808;
  undefined1 *local_1800;
  undefined1 *local_17f8;
  char *local_17f0;
  char *local_17e8;
  char *local_17e0;
  char *local_17d8;
  undefined1 *local_17d0;
  undefined1 *local_17c8;
  char *local_17c0;
  char *local_17b8;
  char *local_17b0;
  char *local_17a8;
  undefined1 *local_17a0;
  undefined1 *local_1798;
  char *local_1790;
  char *local_1788;
  char *local_1780;
  char *local_1778;
  undefined1 *local_1770;
  undefined1 *local_1768;
  char *local_1760;
  char *local_1758;
  undefined1 *local_1750;
  undefined1 *local_1748;
  char *local_1740;
  char *local_1738;
  undefined1 *local_1730;
  undefined1 *local_1728;
  char *local_1720;
  char *local_1718;
  undefined1 *local_1710;
  undefined1 *local_1708;
  char *local_1700;
  char *local_16f8;
  undefined1 *local_16f0;
  undefined1 *local_16e8;
  char *local_16e0;
  char *local_16d8;
  char *local_16d0;
  char *local_16c8;
  undefined1 *local_16c0;
  undefined1 *local_16b8;
  char *local_16b0;
  char *local_16a8;
  undefined1 *local_16a0;
  undefined1 *local_1698;
  char *local_1690;
  char *local_1688;
  undefined8 local_1680;
  _Rb_tree_node_base local_1678;
  undefined1 *local_1658;
  undefined1 *local_1650;
  char *local_1648;
  char *local_1640;
  char *local_1638;
  char *local_1630;
  undefined1 *local_1628;
  undefined1 *local_1620;
  char *local_1618;
  char *local_1610;
  undefined1 *local_1608;
  undefined1 *local_1600;
  char *local_15f8;
  char *local_15f0;
  undefined1 local_15e8 [40];
  char *local_15c0;
  char *local_15b8;
  undefined1 *local_15b0;
  undefined1 *local_15a8;
  char *local_15a0;
  char *local_1598;
  undefined1 local_1590 [16];
  char *local_1580 [2];
  undefined1 *local_1570;
  undefined1 *local_1568;
  char *local_1560;
  char *local_1558;
  char *local_1550;
  char *local_1548;
  undefined1 *local_1540;
  undefined1 *local_1538;
  char *local_1530;
  char *local_1528;
  pointer local_1520;
  undefined1 *local_1518;
  char *local_1510;
  char *local_1508;
  undefined1 *local_1500;
  undefined1 *local_14f8;
  char *local_14f0;
  char *local_14e8;
  char *local_14e0;
  char *local_14d8;
  pointer local_14d0;
  undefined1 *local_14c8;
  char *local_14c0;
  char *local_14b8;
  pointer local_14b0;
  pointer local_14a8;
  char *local_14a0;
  char *local_1498;
  undefined1 *local_1490;
  _Base_ptr local_1488;
  char *local_1480;
  _Base_ptr local_1478;
  char *local_1470;
  char *local_1468;
  undefined1 *local_1460;
  _Base_ptr local_1458;
  char *local_1450;
  _Base_ptr local_1448;
  undefined1 *local_1440;
  undefined1 *local_1438;
  char *local_1430;
  _Base_ptr local_1428;
  char *local_1420;
  _Base_ptr local_1418;
  undefined1 *local_1410;
  undefined1 *local_1408;
  char *local_1400;
  seconds local_13f8;
  CFeeRate local_13f0;
  CFeeRate local_13e8;
  char *local_13e0;
  _Optional_payload_base<unsigned_int> local_13d8;
  char *local_13d0;
  char *local_13c8;
  undefined1 *local_13c0;
  undefined1 *local_13b8;
  char *local_13b0;
  ValidationSignals *local_13a8;
  undefined1 *local_13a0;
  undefined1 *local_1398;
  char *local_1390;
  char *local_1388;
  char *local_1380;
  char *local_1378;
  undefined1 *local_1370;
  undefined1 *local_1368;
  char *local_1360;
  char *local_1358;
  undefined1 *local_1350;
  undefined1 *local_1348;
  char *local_1340;
  char *local_1338;
  undefined1 *local_1330;
  undefined1 *local_1328;
  char *local_1320;
  char *local_1318;
  char *local_1310;
  char *local_1308;
  undefined1 *local_1300;
  undefined1 *local_12f8;
  char *local_12f0;
  char *local_12e8;
  undefined1 *local_12e0;
  undefined1 *local_12d8;
  char *local_12d0;
  char *local_12c8;
  undefined1 *local_12c0;
  undefined1 *local_12b8;
  char *local_12b0;
  char *local_12a8;
  char *local_12a0;
  char *local_1298;
  undefined1 *local_1290;
  undefined1 *local_1288;
  char *local_1280;
  char *local_1278;
  undefined1 *local_1270;
  undefined1 *local_1268;
  char *local_1260;
  char *local_1258;
  undefined1 *local_1250;
  undefined1 *local_1248;
  char *local_1240;
  char *local_1238;
  char *local_1230;
  char *local_1228;
  undefined1 *local_1220;
  undefined1 *local_1218;
  char *local_1210;
  char *local_1208;
  undefined1 *local_1200;
  undefined1 *local_11f8;
  char *local_11f0;
  char *local_11e8;
  undefined1 *local_11e0;
  undefined1 *local_11d8;
  char *local_11d0;
  char *local_11c8;
  char *local_11c0;
  char *local_11b8;
  undefined1 *local_11b0;
  undefined1 *local_11a8;
  char *local_11a0;
  char *local_1198;
  undefined1 *local_1190;
  undefined1 *local_1188;
  char *local_1180;
  char *local_1178;
  undefined1 *local_1170;
  undefined1 *local_1168;
  char *local_1160;
  char *local_1158;
  char *local_1150;
  char *local_1148;
  undefined1 *local_1140;
  undefined1 *local_1138;
  char *local_1130;
  char *local_1128;
  undefined1 *local_1120;
  undefined1 *local_1118;
  char *local_1110;
  char *local_1108;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  char *local_10f0;
  char *local_10e8;
  char *local_10e0;
  char *local_10d8;
  undefined1 *local_10d0;
  undefined1 *local_10c8;
  char *local_10c0;
  char *local_10b8;
  char *local_10b0;
  char *local_10a8;
  undefined1 *local_10a0;
  undefined1 *local_1098;
  char *local_1090;
  char *local_1088;
  char *local_1080;
  char *local_1078;
  undefined1 *local_1070;
  undefined1 *local_1068;
  char *local_1060;
  char *local_1058;
  undefined1 *local_1050;
  undefined1 *local_1048;
  char *local_1040;
  char *local_1038;
  undefined1 *local_1030;
  undefined1 *local_1028;
  char *local_1020;
  char *local_1018;
  char *local_1010;
  char *local_1008;
  undefined1 *local_1000;
  undefined1 *local_ff8;
  char *local_ff0;
  char *local_fe8;
  undefined1 *local_fe0;
  undefined1 *local_fd8;
  char *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  undefined1 *local_fb0;
  undefined1 *local_fa8;
  char *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  undefined1 *local_f80;
  undefined1 *local_f78;
  char *local_f70;
  char *local_f68;
  undefined1 *local_f60;
  undefined1 *local_f58;
  char *local_f50;
  char *local_f48;
  undefined1 *local_f40;
  undefined1 *local_f38;
  char *local_f30;
  char *local_f28;
  char *local_f20;
  char *local_f18;
  undefined1 *local_f10;
  undefined1 *local_f08;
  char *local_f00;
  char *local_ef8;
  undefined1 *local_ef0;
  undefined1 *local_ee8;
  char *local_ee0;
  char *local_ed8;
  undefined1 *local_ed0;
  undefined1 *local_ec8;
  char *local_ec0;
  char *local_eb8;
  char *local_eb0;
  char *local_ea8;
  undefined1 *local_ea0;
  undefined1 *local_e98;
  char *local_e90;
  char *local_e88;
  undefined1 *local_e80;
  undefined1 *local_e78;
  char *local_e70;
  char *local_e68;
  char *local_e60;
  char *local_e58;
  undefined1 *local_e50;
  undefined1 *local_e48;
  char *local_e40;
  char *local_e38;
  undefined1 *local_e30;
  undefined1 *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  undefined1 *local_e00;
  undefined1 *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  undefined1 *local_dd0;
  undefined1 *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  undefined1 *local_da0;
  undefined1 *local_d98;
  char *local_d90;
  char *local_d88;
  undefined1 *local_d80;
  undefined1 *local_d78;
  char *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  undefined1 *local_d50;
  undefined1 *local_d48;
  char *local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  undefined1 *local_d20;
  undefined1 *local_d18;
  char *local_d10;
  char *local_d08;
  undefined1 *local_d00;
  undefined1 *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  char *local_cd8;
  undefined1 *local_cd0;
  undefined1 *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_ca8;
  undefined1 *local_ca0;
  undefined1 *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  undefined1 *local_c70;
  undefined1 *local_c68;
  char *local_c60;
  char *local_c58;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  undefined1 local_c48 [8];
  _Rb_tree_node_base local_c40;
  undefined1 local_c20 [8];
  _Rb_tree_node_base local_c18;
  undefined1 local_bf8 [16];
  undefined1 local_be8 [24];
  optional<wallet::SelectionResult> result23;
  optional<wallet::SelectionResult> result22;
  optional<wallet::SelectionResult> result21;
  optional<wallet::SelectionResult> result20;
  optional<wallet::SelectionResult> result19;
  optional<wallet::SelectionResult> result18;
  optional<wallet::SelectionResult> result17;
  optional<wallet::SelectionResult> result16;
  optional<wallet::SelectionResult> result15;
  optional<wallet::SelectionResult> result14;
  optional<wallet::SelectionResult> result13;
  optional<wallet::SelectionResult> result12;
  optional<wallet::SelectionResult> result11;
  optional<wallet::SelectionResult> result10;
  optional<wallet::SelectionResult> result9;
  optional<wallet::SelectionResult> result8;
  optional<wallet::SelectionResult> result7;
  optional<wallet::SelectionResult> result6;
  optional<wallet::SelectionResult> result5;
  optional<wallet::SelectionResult> result4;
  optional<wallet::SelectionResult> result3;
  optional<wallet::SelectionResult> result2;
  optional<wallet::SelectionResult> result1;
  CoinsResult available_coins;
  FastRandomContext rand;
  
  local_1030 = (undefined1 *)0x0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rand,false);
  puVar1 = (undefined1 *)
           ((long)&result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                   super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                   super__Optional_payload_base<wallet::SelectionResult>._M_payload + 0x10);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result1,"");
  NewWallet((NodeContext *)&wallet,
            (string *)
            (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chain._M_t.
            super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
            super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
            super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl);
  if ((undefined1 *)
      result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ != puVar1) {
    operator_delete((void *)result1.super__Optional_base<wallet::SelectionResult,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                            super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_,
                    (ulong)((long)&(result1.
                                    super__Optional_base<wallet::SelectionResult,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>
                                    .super__Optional_payload_base<wallet::SelectionResult>.
                                    _M_payload._M_value.m_selected_inputs._M_t._M_impl.
                                    super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
  }
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  iVar14 = 0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    CoinsResult::Clear(&available_coins);
    local_c60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c58 = "";
    local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1ff;
    file.m_begin = (iterator)&local_c60;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c70,msg);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    _cVar16 = 0x79d64e;
    KnapsackSolver(&result1,pvVar6,(CAmount *)&result5,1000000,&rand);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013b1d;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT)"
         + 0x60;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
    local_c80 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c78 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar16,
               (size_t)&local_c80,0x1ff);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    if (result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result1);
    }
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pvVar10 = (iterator)0x4;
    pvVar12 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
             (CFeeRate)0x0,4,false,0,false,in_stack_ffffffffffffe718);
    local_c90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c88 = "";
    local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x204;
    file_00.m_begin = (iterator)&local_c90;
    msg_00.m_end = pvVar12;
    msg_00.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_ca0,
               msg_00);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    _cVar16 = 0x79d7fe;
    KnapsackSolver(&result1,pvVar6,(CAmount *)&result5,1000000,&rand);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013b1d;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT)"
         + 0x60;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
    local_cb0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ca8 = "";
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar16,
               (size_t)&local_cb0,0x204);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    if (result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result1);
    }
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pFVar11 = &rand;
    KnapsackSolver(&result1,pvVar6,(CAmount *)&result2,1000000,pFVar11);
    local_cc0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_cb8 = "";
    local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_cc8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79d977;
    file_01.m_end = (iterator)0x208;
    file_01.m_begin = (iterator)&local_cc0;
    msg_01.m_end = pvVar10;
    msg_01.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_cd0,
               msg_01);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_724f65;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result1" + 7;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
    local_ce0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_cd8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar16,
               (size_t)&local_ce0,0x208);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_cf0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ce8 = "";
    local_d00 = &boost::unit_test::basic_cstring<char_const>::null;
    local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x209;
    file_02.m_begin = (iterator)&local_cf0;
    msg_02.m_end = pvVar12;
    msg_02.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_d00,
               msg_02);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result1);
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 1000000;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result9;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result10;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result5,(lazy_ostream *)&result4,1,2,REQUIRE,0xf5e077,
               (size_t)&result6,0x209,&result2,"1 * CENT",(SelectionResult *)&result3);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 2000000;
    pvVar10 = (iterator)0x90;
    pvVar12 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result2,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    local_d10 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d08 = "";
    local_d20 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x20e;
    file_03.m_begin = (iterator)&local_d10;
    msg_03.m_end = pvVar12;
    msg_03.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_d20,
               msg_03);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 3000000;
    _cVar16 = 0x79dcad;
    KnapsackSolver(&result2,pvVar6,(CAmount *)&result6,1000000,&rand);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013b37;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 3 * CENT, CENT)"
         + 0x60;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
    local_d30 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d28 = "";
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar16,
               (size_t)&local_d30,0x20e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    if (result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result2);
    }
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 3000000;
    pFVar11 = &rand;
    KnapsackSolver(&result2,pvVar6,(CAmount *)&result3,1000000,pFVar11);
    local_d40 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d38 = "";
    local_d50 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79de28;
    file_04.m_end = (iterator)0x212;
    file_04.m_begin = (iterator)&local_d40;
    msg_04.m_end = pvVar10;
    msg_04.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_d50,
               msg_04);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_724f92;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result2" + 7;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
    local_d60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d58 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar16,
               (size_t)&local_d60,0x212);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_d70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d68 = "";
    local_d80 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x213;
    file_05.m_begin = (iterator)&local_d70;
    msg_05.m_end = pvVar12;
    msg_05.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_d80,
               msg_05);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result2);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 3000000;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 3000000;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result10;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result11;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result9;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result6,(lazy_ostream *)&result5,1,2,REQUIRE,0xf5e0bf,
               (size_t)&result7,0x213,(SelectionResult *)&result3,"3 * CENT",&result4);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result6.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result3,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 10000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result3,
             (CFeeRate)0x0,3,true,0,false,in_stack_ffffffffffffe718);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 20000000;
    pvVar10 = (iterator)0x90;
    pvVar12 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result3,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    local_d90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d88 = "";
    local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x21c;
    file_06.m_begin = (iterator)&local_d90;
    msg_06.m_end = pvVar12;
    msg_06.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_da0,
               msg_06);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 38000000;
    _cVar16 = 0x79e1c0;
    KnapsackSolver(&result3,pvVar6,(CAmount *)&result7,1000000,&rand);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013b4f;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 38 * CENT, CENT)"
         + 0x61;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
    local_db0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_da8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result5,(lazy_ostream *)&result4,1,0,WARN,_cVar16,
               (size_t)&local_db0,0x21c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    if (result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result3);
    }
    local_dc0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_db8 = "";
    local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x21e;
    file_07.m_begin = (iterator)&local_dc0;
    msg_07.m_end = pvVar12;
    msg_07.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_dd0,
               msg_07);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard_extra);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 38000000;
    _cVar16 = 0x79e334;
    KnapsackSolver(&result3,pvVar6,(CAmount *)&result7,1000000,&rand);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013b5b;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard_extra), 38 * CENT, CENT)"
         + 0x67;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
    local_de0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_dd8 = "";
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result5,(lazy_ostream *)&result4,1,0,WARN,_cVar16,
               (size_t)&local_de0,0x21e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    if (result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result3);
    }
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 37000000;
    pFVar11 = &rand;
    KnapsackSolver(&result3,pvVar6,(CAmount *)&result4,1000000,pFVar11);
    local_df0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_de8 = "";
    local_e00 = &boost::unit_test::basic_cstring<char_const>::null;
    local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79e4a6;
    file_08.m_end = (iterator)0x221;
    file_08.m_begin = (iterator)&local_df0;
    msg_08.m_end = pvVar10;
    msg_08.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_e00,
               msg_08);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013885;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result3" + 7;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
    local_e10 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e08 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result5,(lazy_ostream *)&result4,1,0,WARN,_cVar16,
               (size_t)&local_e10,0x221);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_e20 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e18 = "";
    local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x222;
    file_09.m_begin = (iterator)&local_e20;
    msg_09.m_end = pvVar12;
    msg_09.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_e30,
               msg_09);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result3);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 37000000;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 37000000;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result9;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result12;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result10;
    pvVar10 = (iterator)0x2;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = (_Base_ptr)&result11;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result7,(lazy_ostream *)&result6,1,2,REQUIRE,0xf5e118,
               (size_t)&result8,0x222,&result4,"37 * CENT",&result5);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result7.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 38000000;
    pFVar11 = &rand;
    KnapsackSolver(&result4,pvVar6,(CAmount *)&result5,1000000,pFVar11);
    local_e40 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e38 = "";
    local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e48 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79e7ae;
    file_10.m_end = (iterator)0x225;
    file_10.m_begin = (iterator)&local_e40;
    msg_10.m_end = pvVar10;
    msg_10.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_e50,
               msg_10);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_20138ca;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result4" + 7;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
    local_e60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e58 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result6,(lazy_ostream *)&result5,1,0,WARN,_cVar16,
               (size_t)&local_e60,0x225);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result6.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_e70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e68 = "";
    local_e80 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e78 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x226;
    file_11.m_begin = (iterator)&local_e70;
    msg_11.m_end = pvVar12;
    msg_11.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_e80,
               msg_11);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result4);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 38000000;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 38000000;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result12;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result10;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result13;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x2;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result11;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result8,(lazy_ostream *)&result7,1,2,REQUIRE,0xf5e17a,
               (size_t)&result9,0x226,&result5,"38 * CENT",&result6);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result8.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 34000000;
    pFVar11 = &rand;
    KnapsackSolver(&result5,pvVar6,(CAmount *)&result6,1000000,pFVar11);
    local_e90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e88 = "";
    local_ea0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79eab8;
    file_12.m_end = (iterator)0x22a;
    file_12.m_begin = (iterator)&local_e90;
    msg_12.m_end = pvVar10;
    msg_12.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_ea0,
               msg_12);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013904;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result5" + 7;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
    local_eb0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ea8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result7,(lazy_ostream *)&result6,1,0,WARN,_cVar16,
               (size_t)&local_eb0,0x22a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result7.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_ec0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_eb8 = "";
    local_ed0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ec8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x22b;
    file_13.m_begin = (iterator)&local_ec0;
    msg_13.m_end = pvVar12;
    msg_13.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_ed0,
               msg_13);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result5);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 35000000;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 35000000;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result13;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result11;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result14;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result12;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result9,(lazy_ostream *)&result8,1,2,REQUIRE,0xf5e22c,
               (size_t)&result10,0x22b,&result6,"35 * CENT",&result7);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result9.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_ee0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ed8 = "";
    local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ee8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x22c;
    file_14.m_begin = (iterator)&local_ee0;
    msg_14.m_end = pvVar12;
    msg_14.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_ef0,
               msg_14);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result5);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 3;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 3;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result13;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result14;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result12;
    pvVar10 = (iterator)0x2;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result11;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result9,(lazy_ostream *)&result8,1,2,REQUIRE,0xf5e7cf,
               (size_t)&result10,0x22c,&result6,"3U",&result7);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result9.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 7000000;
    pFVar11 = &rand;
    KnapsackSolver(&result6,pvVar6,(CAmount *)&result7,1000000,pFVar11);
    local_f00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ef8 = "";
    local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f08 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79ef89;
    file_15.m_end = (iterator)0x230;
    file_15.m_begin = (iterator)&local_f00;
    msg_15.m_end = pvVar10;
    msg_15.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_f10,
               msg_15);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013bcd;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result6" + 7;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result9;
    local_f20 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f18 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result8,(lazy_ostream *)&result7,1,0,WARN,_cVar16,
               (size_t)&local_f20,0x230);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result8.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_f30 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f28 = "";
    local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f38 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x231;
    file_16.m_begin = (iterator)&local_f30;
    msg_16.m_end = pvVar12;
    msg_16.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_f40,
               msg_16);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result6);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 7000000;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 7000000;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result14;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result12;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result15;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result13;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result10,(lazy_ostream *)&result9,1,2,REQUIRE,0xf5e7f5,
               (size_t)&result11,0x231,&result7,"7 * CENT",&result8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result10.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_f50 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f48 = "";
    local_f60 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f58 = &boost::unit_test::basic_cstring<char_const>::null;
    file_17.m_end = (iterator)0x232;
    file_17.m_begin = (iterator)&local_f50;
    msg_17.m_end = pvVar12;
    msg_17.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_f60,
               msg_17);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result6);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 2;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 2;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result14;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result12;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result15;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result13;
    pvVar10 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result10,(lazy_ostream *)&result9,1,2,REQUIRE,0xf5e811,
               (size_t)&result11,0x232,&result7,"2U",&result8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result10.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 8000000;
    pFVar11 = &rand;
    KnapsackSolver(&result7,pvVar6,(CAmount *)&result8,1000000,pFVar11);
    local_f70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f68 = "";
    local_f80 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79f458;
    file_18.m_end = (iterator)0x236;
    file_18.m_begin = (iterator)&local_f70;
    msg_18.m_end = pvVar10;
    msg_18.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_f80,
               msg_18);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013976;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result7" + 7;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result10;
    local_f90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f88 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result9,(lazy_ostream *)&result8,1,0,WARN,_cVar16,
               (size_t)&local_f90,0x236);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result9.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_fa0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f98 = "";
    local_fb0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_19.m_end = (iterator)0x237;
    file_19.m_begin = (iterator)&local_fa0;
    msg_19.m_end = pvVar12;
    msg_19.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_fb0,
               msg_19);
    _cVar16 = 0x79f573;
    CVar8 = SelectionResult::GetSelectedValue((SelectionResult *)&result7);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ = CVar8 == 8000000;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013c09;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)"result7->GetSelectedValue() == 8 * CENT" + 0x27;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result10;
    local_fc0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_fb8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result9,(lazy_ostream *)&result8,1,0,WARN,_cVar16,
               (size_t)&local_fc0,0x237);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result9.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_fd0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_fc8 = "";
    local_fe0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_fd8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_20.m_end = (iterator)0x238;
    file_20.m_begin = (iterator)&local_fd0;
    msg_20.m_end = pvVar12;
    msg_20.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_fe0,
               msg_20);
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result7);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 3;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 3;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result15;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result13;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result16;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result14;
    pvVar10 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result11,(lazy_ostream *)&result10,1,2,REQUIRE,0xf5e857,
               (size_t)&result12,0x238,&result8,"3U",&result9);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result11.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 9000000;
    pFVar11 = &rand;
    KnapsackSolver(&result8,pvVar6,(CAmount *)&result9,1000000,pFVar11);
    local_ff0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_fe8 = "";
    local_1000 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ff8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79f891;
    file_21.m_end = (iterator)0x23c;
    file_21.m_begin = (iterator)&local_ff0;
    msg_21.m_end = pvVar10;
    msg_21.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_1000,
               msg_21);
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013982;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result8" + 7;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_1010 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1008 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result11;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result10,(lazy_ostream *)&result9,1,0,WARN,_cVar16,
               (size_t)&local_1010,0x23c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result10.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1020 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1018 = "";
    local_1030 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1028 = &boost::unit_test::basic_cstring<char_const>::null;
    file_22.m_end = (iterator)0x23d;
    file_22.m_begin = (iterator)&local_1020;
    msg_22.m_end = pvVar12;
    msg_22.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_1030,
               msg_22);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result8);
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 10000000;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 10000000;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result16;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result14;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result17;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result15;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result12,(lazy_ostream *)&result11,1,2,REQUIRE,0xf5e2d4,
               (size_t)&result13,0x23d,&result9,"10 * CENT",&result10);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result12.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1040 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1038 = "";
    local_1050 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1048 = &boost::unit_test::basic_cstring<char_const>::null;
    file_23.m_end = (iterator)0x23e;
    file_23.m_begin = (iterator)&local_1040;
    msg_23.m_end = pvVar12;
    msg_23.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_1050,
               msg_23);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result8);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 1;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result16;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result14;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result17;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result15;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result12,(lazy_ostream *)&result11,1,2,REQUIRE,0xf5e875,
               (size_t)&result13,0x23e,&result9,"1U",&result10);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result12.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    CoinsResult::Clear(&available_coins);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 6000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 7000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 8000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 20000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 30000000;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 71000000;
    pFVar11 = &rand;
    KnapsackSolver(&result9,pvVar6,(CAmount *)&result10,1000000,pFVar11);
    local_1060 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1058 = "";
    local_1070 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1068 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x79fe58;
    file_24.m_end = (iterator)0x24b;
    file_24.m_begin = (iterator)&local_1060;
    msg_24.m_end = pvVar10;
    msg_24.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_1070,
               msg_24);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_20139e6;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result9" + 7;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result12;
    local_1080 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1078 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result11,(lazy_ostream *)&result10,1,0,WARN,_cVar16,
               (size_t)&local_1080,0x24b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result11.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1090 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1088 = "";
    local_10a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
    file_25.m_end = (iterator)0x24c;
    file_25.m_begin = (iterator)&local_1090;
    msg_25.m_end = pvVar12;
    msg_25.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_10a0,
               msg_25);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 72000000;
    _cVar16 = 0x79ffa9;
    KnapsackSolver(&result10,pvVar6,(CAmount *)&result14,1000000,&rand);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013c39;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 72 * CENT, CENT)"
         + 0x62;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result13;
    local_10b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_10a8 = "";
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result12,(lazy_ostream *)&result11,1,0,WARN,_cVar16,
               (size_t)&local_10b0,0x24c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result12.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    if (result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result10);
    }
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (long)
         "[\n[\"The following are deserialized transactions which are valid.\"],\n[\"They are in the form\"],\n[\"[[[prevout hash, prevout index, prevout scriptPubKey, amount?], [input 2], ...],\"],\n[\"serializedTransaction, excluded verifyFlags]\"],\n[\"Objects that are only a single string (like this one) are ignored\"],\n\n[\"The following is 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is of particular interest because it contains an invalidly-encoded signature which OpenSSL accepts\"],\n[\"See http://r6.ca/blog/20111119T211504Z.html\"],\n[\"It is also the first OP_CHECKMULTISIG transaction in standard form\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e1060bc14e518db2b49aa43ad90ba26000000000490047304402203f16c6f40162ab686621ef3000b04e75418a0c0cb2d8aebeac894ae360ac1e780220ddc15ecdfc3507ac48e1681a33eb60996631bf6bf5bc0a0682c4db743ce7ca2b01ffffffff0140420f00000000001976a914660d4ef3a743e3e696ad990364e555c271ad504b88ac00000000\", \"DERSIG,LOW_S,STRICTENC\"],\n\n[\"The following is a tweaked form of 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is an OP_CHECKMULTISIG with an arbitrary extra byte stuffed into the signature at pos length - 2\"],\n[\"The dummy byte is fine however, so the NULLDUMMY flag should be happy\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e10..." /* TRUNCATED STRING LITERAL */
         + 0x21770;
    pFVar11 = &rand;
    KnapsackSolver(&result10,pvVar6,(CAmount *)&result11,1000000,pFVar11);
    local_10c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_10b8 = "";
    local_10d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_10c8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a0124;
    file_26.m_end = (iterator)0x250;
    file_26.m_begin = (iterator)&local_10c0;
    msg_26.m_end = pvVar10;
    msg_26.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_10d0,
               msg_26);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013a07;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result10" + 8;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result13;
    local_10e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_10d8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result12,(lazy_ostream *)&result11,1,0,WARN,_cVar16,
               (size_t)&local_10e0,0x250);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result12.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_10f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_10e8 = "";
    local_1100 = &boost::unit_test::basic_cstring<char_const>::null;
    local_10f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_27.m_end = (iterator)0x251;
    file_27.m_begin = (iterator)&local_10f0;
    msg_27.m_end = pvVar12;
    msg_27.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_1100,
               msg_27);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result10);
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 20000000;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 20000000;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result18;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result16;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result19;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result17;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result14,(lazy_ostream *)&result13,1,2,REQUIRE,0xf5e8f6,
               (size_t)&result15,0x251,(SelectionResult *)&result11,"20 * CENT",&result12);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result14.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1108 = "";
    local_1120 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1118 = &boost::unit_test::basic_cstring<char_const>::null;
    file_28.m_end = (iterator)0x252;
    file_28.m_begin = (iterator)&local_1110;
    msg_28.m_end = pvVar12;
    msg_28.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_1120,
               msg_28);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result10);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 1;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result18;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result16;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result19;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result17;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result14,(lazy_ostream *)&result13,1,2,REQUIRE,0xf5e91d,
               (size_t)&result15,0x252,(SelectionResult *)&result11,"1U",&result12);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result14.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result11,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (long)
         "[\n[\"The following are deserialized transactions which are valid.\"],\n[\"They are in the form\"],\n[\"[[[prevout hash, prevout index, prevout scriptPubKey, amount?], [input 2], ...],\"],\n[\"serializedTransaction, excluded verifyFlags]\"],\n[\"Objects that are only a single string (like this one) are ignored\"],\n\n[\"The following is 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is of particular interest because it contains an invalidly-encoded signature which OpenSSL accepts\"],\n[\"See http://r6.ca/blog/20111119T211504Z.html\"],\n[\"It is also the first OP_CHECKMULTISIG transaction in standard form\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e1060bc14e518db2b49aa43ad90ba26000000000490047304402203f16c6f40162ab686621ef3000b04e75418a0c0cb2d8aebeac894ae360ac1e780220ddc15ecdfc3507ac48e1681a33eb60996631bf6bf5bc0a0682c4db743ce7ca2b01ffffffff0140420f00000000001976a914660d4ef3a743e3e696ad990364e555c271ad504b88ac00000000\", \"DERSIG,LOW_S,STRICTENC\"],\n\n[\"The following is a tweaked form of 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is an OP_CHECKMULTISIG with an arbitrary extra byte stuffed into the signature at pos length - 2\"],\n[\"The dummy byte is fine however, so the NULLDUMMY flag should be happy\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e10..." /* TRUNCATED STRING LITERAL */
         + 0x21770;
    pFVar11 = &rand;
    KnapsackSolver(&result11,pvVar6,(CAmount *)&result12,1000000,pFVar11);
    local_1130 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1128 = "";
    local_1140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1138 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a060e;
    file_29.m_end = (iterator)0x258;
    file_29.m_begin = (iterator)&local_1130;
    msg_29.m_end = pvVar10;
    msg_29.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_1140,
               msg_29);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013c93;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result11" + 8;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result14;
    local_1150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1148 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result13,(lazy_ostream *)&result12,1,0,WARN,_cVar16,
               (size_t)&local_1150,600);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result13.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1160 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1158 = "";
    local_1170 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1168 = &boost::unit_test::basic_cstring<char_const>::null;
    file_30.m_end = (iterator)0x259;
    file_30.m_begin = (iterator)&local_1160;
    msg_30.m_end = pvVar12;
    msg_30.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_1170,
               msg_30);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result11);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = (long)"" + 0xdde0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         (char *)result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                 super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                 super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == "";
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result19;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result17;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result20;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result18;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result15,(lazy_ostream *)&result14,1,2,REQUIRE,0xf5e945,
               (size_t)&result16,0x259,&result12,"18 * CENT",&result13);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result15.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1178 = "";
    local_1190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1188 = &boost::unit_test::basic_cstring<char_const>::null;
    file_31.m_end = (iterator)0x25a;
    file_31.m_begin = (iterator)&local_1180;
    msg_31.m_end = pvVar12;
    msg_31.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_1190,
               msg_31);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result11);
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 3;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 3;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result19;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result17;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result20;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result18;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result15,(lazy_ostream *)&result14,1,2,REQUIRE,0xf5e96c,
               (size_t)&result16,0x25a,&result12,"3U",&result13);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result15.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = (long)"" + 0xdde0;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result12,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (long)
         "[\n[\"The following are deserialized transactions which are valid.\"],\n[\"They are in the form\"],\n[\"[[[prevout hash, prevout index, prevout scriptPubKey, amount?], [input 2], ...],\"],\n[\"serializedTransaction, excluded verifyFlags]\"],\n[\"Objects that are only a single string (like this one) are ignored\"],\n\n[\"The following is 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is of particular interest because it contains an invalidly-encoded signature which OpenSSL accepts\"],\n[\"See http://r6.ca/blog/20111119T211504Z.html\"],\n[\"It is also the first OP_CHECKMULTISIG transaction in standard form\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e1060bc14e518db2b49aa43ad90ba26000000000490047304402203f16c6f40162ab686621ef3000b04e75418a0c0cb2d8aebeac894ae360ac1e780220ddc15ecdfc3507ac48e1681a33eb60996631bf6bf5bc0a0682c4db743ce7ca2b01ffffffff0140420f00000000001976a914660d4ef3a743e3e696ad990364e555c271ad504b88ac00000000\", \"DERSIG,LOW_S,STRICTENC\"],\n\n[\"The following is a tweaked form of 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is an OP_CHECKMULTISIG with an arbitrary extra byte stuffed into the signature at pos length - 2\"],\n[\"The dummy byte is fine however, so the NULLDUMMY flag should be happy\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e10..." /* TRUNCATED STRING LITERAL */
         + 0x21770;
    pFVar11 = &rand;
    KnapsackSolver(&result12,pvVar6,(CAmount *)&result13,1000000,pFVar11);
    local_11a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1198 = "";
    local_11b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_11a8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a0b0a;
    file_32.m_end = (iterator)0x260;
    file_32.m_begin = (iterator)&local_11a0;
    msg_32.m_end = pvVar10;
    msg_32.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_11b0,
               msg_32);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013cc3;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result12" + 8;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result15;
    local_11c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_11b8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result14,(lazy_ostream *)&result13,1,0,WARN,_cVar16,
               (size_t)&local_11c0,0x260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result14.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_11d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_11c8 = "";
    local_11e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_11d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_33.m_end = (iterator)0x261;
    file_33.m_begin = (iterator)&local_11d0;
    msg_33.m_end = pvVar12;
    msg_33.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_11e0,
               msg_33);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result12);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = (long)"" + 0xdde0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         (char *)result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                 super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                 super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == "";
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result20;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result18;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result21;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result19;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result16,(lazy_ostream *)&result15,1,2,REQUIRE,0xf5e994,
               (size_t)&result17,0x261,&result13,"18 * CENT",(lazy_ostream *)&result14);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result16.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_11f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_11e8 = "";
    local_1200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_11f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_34.m_end = (iterator)0x262;
    file_34.m_begin = (iterator)&local_11f0;
    msg_34.m_end = pvVar12;
    msg_34.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_1200,
               msg_34);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result12);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 1;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result20;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result18;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result21;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result19;
    pvVar10 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result16,(lazy_ostream *)&result15,1,2,REQUIRE,0xf5e9b1,
               (size_t)&result17,0x262,&result13,"1U",(lazy_ostream *)&result14);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result16.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 11000000;
    pFVar11 = &rand;
    KnapsackSolver(&result13,pvVar6,(CAmount *)&result14,1000000,pFVar11);
    local_1210 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1208 = "";
    local_1220 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a0fc7;
    file_35.m_end = (iterator)0x266;
    file_35.m_begin = (iterator)&local_1210;
    msg_35.m_end = pvVar10;
    msg_35.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_1220,
               msg_35);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013ce7;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result13" + 8;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result16;
    local_1230 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1228 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result15,(lazy_ostream *)&result14,1,0,WARN,_cVar16,
               (size_t)&local_1230,0x266);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result15.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1240 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1238 = "";
    local_1250 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1248 = &boost::unit_test::basic_cstring<char_const>::null;
    file_36.m_end = (iterator)0x267;
    file_36.m_begin = (iterator)&local_1240;
    msg_36.m_end = pvVar12;
    msg_36.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_1250,
               msg_36);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result13);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 11000000;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 11000000;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result21;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result19;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result22;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result20;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result17,(lazy_ostream *)&result16,1,2,REQUIRE,0xf5e9d9,
               (size_t)&result18,0x267,(SelectionResult *)&result14,"11 * CENT",&result15);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result17.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1260 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1258 = "";
    local_1270 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1268 = &boost::unit_test::basic_cstring<char_const>::null;
    file_37.m_end = (iterator)0x268;
    file_37.m_begin = (iterator)&local_1260;
    msg_37.m_end = pvVar12;
    msg_37.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_1270,
               msg_37);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result13);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 2;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 2;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result21;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result19;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result22;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result20;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result17,(lazy_ostream *)&result16,1,2,REQUIRE,0xf5e9f6,
               (size_t)&result18,0x268,(SelectionResult *)&result14,"2U",&result15);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result17.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result14,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 200000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result14,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 300000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result14,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 400000000;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result14,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 95000000;
    pFVar11 = &rand;
    KnapsackSolver(&result14,pvVar6,(CAmount *)&result15,1000000,pFVar11);
    local_1280 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1278 = "";
    local_1290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1288 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a154c;
    file_38.m_end = (iterator)0x270;
    file_38.m_begin = (iterator)&local_1280;
    msg_38.m_end = pvVar10;
    msg_38.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_1290,
               msg_38);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013d17;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result14" + 8;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result17;
    local_12a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1298 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result16,(lazy_ostream *)&result15,1,0,WARN,_cVar16,
               (size_t)&local_12a0,0x270);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result16.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_12b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_12a8 = "";
    local_12c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_12b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_39.m_end = (iterator)0x271;
    file_39.m_begin = (iterator)&local_12b0;
    msg_39.m_end = pvVar12;
    msg_39.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_12c0,
               msg_39);
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result14);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000000;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 100000000;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result22;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result20;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result23;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result21;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result18,(lazy_ostream *)&result17,1,2,REQUIRE,0xf5ea1e,
               (size_t)&result19,0x271,&result15,"1 * COIN",&result16);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result18.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_12d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_12c8 = "";
    local_12e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_12d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_40.m_end = (iterator)0x272;
    file_40.m_begin = (iterator)&local_12d0;
    msg_40.m_end = pvVar12;
    msg_40.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_12e0,
               msg_40);
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result14);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 1;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result22;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result20;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result23;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result21;
    pvVar10 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result18,(lazy_ostream *)&result17,1,2,REQUIRE,0xf5ea44,
               (size_t)&result19,0x272,&result15,"1U",(SelectionResult *)&result16);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result18.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 195000000;
    pFVar11 = &rand;
    KnapsackSolver(&result15,pvVar6,(CAmount *)&result16,1000000,pFVar11);
    local_12f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_12e8 = "";
    local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
    local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a1a12;
    file_41.m_end = (iterator)0x275;
    file_41.m_begin = (iterator)&local_12f0;
    msg_41.m_end = pvVar10;
    msg_41.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_1300,
               msg_41);
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013d47;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result15" + 8;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result18;
    local_1310 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1308 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result17,(lazy_ostream *)&result16,1,0,WARN,_cVar16,
               (size_t)&local_1310,0x275);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result17.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1320 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1318 = "";
    local_1330 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1328 = &boost::unit_test::basic_cstring<char_const>::null;
    file_42.m_end = (iterator)0x276;
    file_42.m_begin = (iterator)&local_1320;
    msg_42.m_end = pvVar12;
    msg_42.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_1330,
               msg_42);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result15);
    local_c18._0_8_ =
         (__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>)
         0xbebc200;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 200000000;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result23;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result21;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &local_c18;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result22;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result19,(lazy_ostream *)&result18,1,2,REQUIRE,0xf5ea6c,
               (size_t)&result20,0x276,(SelectionResult *)&result16,"2 * COIN",&result17);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result19.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1340 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1338 = "";
    local_1350 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1348 = &boost::unit_test::basic_cstring<char_const>::null;
    file_43.m_end = (iterator)0x277;
    file_43.m_begin = (iterator)&local_1340;
    msg_43.m_end = pvVar12;
    msg_43.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_1350,
               msg_43);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result15);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_c18._M_color = 1;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 1;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result23;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result21;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &local_c18;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result22;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result19,(lazy_ostream *)&result18,1,2,REQUIRE,0xf5ea92,
               (size_t)&result20,0x277,(SelectionResult *)&result16,"1U",&result17);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result19.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    CoinsResult::Clear(&available_coins);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 200000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 300000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 400000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 500000;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    pFVar11 = &rand;
    KnapsackSolver(&result16,pvVar6,&CENT,1000000,pFVar11);
    local_1360 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1358 = "";
    local_1370 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1368 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a1fbf;
    file_44.m_end = (iterator)0x285;
    file_44.m_begin = (iterator)&local_1360;
    msg_44.m_end = pvVar10;
    msg_44.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_1370,
               msg_44);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013d77;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result16" + 8;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result19;
    local_1380 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1378 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result18,(lazy_ostream *)&result17,1,0,WARN,_cVar16,
               (size_t)&local_1380,0x285);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result18.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1390 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1388 = "";
    local_13a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
    file_45.m_end = (iterator)0x286;
    file_45.m_begin = (iterator)&local_1390;
    msg_45.m_end = pvVar12;
    msg_45.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_13a0,
               msg_45);
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    local_c18._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result16);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         (tuple<const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)
         local_c18._0_8_ == (_Head_base<0UL,_const_NetGroupManager_*,_false>)0xf4240;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &local_c18;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result22;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &CENT;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result23;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result20,(lazy_ostream *)&result19,1,2,REQUIRE,0xf5eaba,
               (size_t)&result21,0x286,(SelectionResult *)&result17,"CENT",&result18);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result20.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x423883c0;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result17,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pFVar11 = &rand;
    KnapsackSolver(&result17,pvVar6,(CAmount *)&result18,1000000,pFVar11);
    local_13b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_13a8 = (ValidationSignals *)0xf5dffd;
    local_13c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_13b8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a22ed;
    file_46.m_end = (iterator)0x28d;
    file_46.m_begin = (iterator)&local_13b0;
    msg_46.m_end = pvVar10;
    msg_46.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_13c0,
               msg_46);
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013da9;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result17" + 8;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result20;
    local_13d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_13c8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result19,(lazy_ostream *)&result18,1,0,WARN,_cVar16,
               (size_t)&local_13d0,0x28d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result19.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_13e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_13d8 = (_Optional_payload_base<unsigned_int>)
                 ((long)
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
                 + 0x72);
    local_13f0.nSatoshisPerK = (CAmount)&boost::unit_test::basic_cstring<char_const>::null;
    local_13e8.nSatoshisPerK = (CAmount)&boost::unit_test::basic_cstring<char_const>::null;
    file_47.m_end = (iterator)0x28e;
    file_47.m_begin = (iterator)&local_13e0;
    msg_47.m_end = pvVar12;
    msg_47.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_13f0,
               msg_47);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    local_c40._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result17);
    local_1678._M_color = 1000000;
    local_1678._4_4_ = 0;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         (Init *)local_c40._0_8_ == (Init *)0xf4240;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &local_c40;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result23;
    local_c18._0_8_ = &local_1678;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_c18;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result21,(lazy_ostream *)&result20,1,2,REQUIRE,0xf5eae0,
               (size_t)&result22,0x28e,(SelectionResult *)&result18,"1 * CENT",&result19);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result21.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 600000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result18,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 700000;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result18,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pFVar11 = &rand;
    KnapsackSolver(&result18,pvVar6,(CAmount *)&result19,1000000,pFVar11);
    local_1400 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_13f8.__r =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    local_1410 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1408 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a2658;
    file_48.m_end = (iterator)0x296;
    file_48.m_begin = (iterator)&local_1400;
    msg_48.m_end = pvVar10;
    msg_48.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_1410,
               msg_48);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013dc1;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result18" + 8;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result21;
    local_1420 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1418 = (_Base_ptr)0xf5dffd;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result20,(lazy_ostream *)&result19,1,0,WARN,_cVar16,
               (size_t)&local_1420,0x296);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result20.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1430 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1428 = (_Base_ptr)0xf5dffd;
    local_1440 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1438 = &boost::unit_test::basic_cstring<char_const>::null;
    file_49.m_end = (iterator)0x297;
    file_49.m_begin = (iterator)&local_1430;
    msg_49.m_end = pvVar12;
    msg_49.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_1440,
               msg_49);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    local_1678._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result18);
    local_be8._0_8_ = (pointer)0xf4240;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         local_1678._0_8_ == 1000000;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    local_c18._0_8_ = &local_1678;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_c18;
    local_c40._0_8_ = local_be8;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_c40;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result22,(lazy_ostream *)&result21,1,2,REQUIRE,0xf5eb06,
               (size_t)&result23,0x297,&result19,"1 * CENT",&result20);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result22.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    CoinsResult::Clear(&available_coins);
    iVar9 = 0x14;
    do {
      result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000000000;
      pvVar10 = (iterator)0x0;
      add_coin(&available_coins,
               (CWallet *)
               wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result19,
               (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 50000000000000;
    pFVar11 = &rand;
    KnapsackSolver(&result19,pvVar6,(CAmount *)&result20,1000000,pFVar11);
    local_1450 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1448 = (_Base_ptr)0xf5dffd;
    local_1460 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1458 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a29be;
    file_50.m_end = (iterator)0x2a0;
    file_50.m_begin = (iterator)&local_1450;
    msg_50.m_end = pvVar10;
    msg_50.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_1460,
               msg_50);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013dda;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result19" + 8;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result22;
    local_1470 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1468 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result21,(lazy_ostream *)&result20,1,0,WARN,_cVar16,
               (size_t)&local_1470,0x2a0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result21.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1480 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1478 = (_Base_ptr)0xf5dffd;
    local_1490 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1488 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    file_51.m_end = (iterator)0x2a1;
    file_51.m_begin = (iterator)&local_1480;
    msg_51.m_end = pvVar12;
    msg_51.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_1490,
               msg_51);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    local_be8._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result19);
    local_bf8._0_8_ = (__uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>)0x2d79883d2000;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         (pointer)local_be8._0_8_ == (pointer)0x2d79883d2000;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c18._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c18._M_parent =
         (_Base_ptr)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72);
    local_c40._0_8_ = local_be8;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_c40;
    local_1678._0_8_ = local_bf8;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_1678;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result23,(lazy_ostream *)&result22,1,2,REQUIRE,0xf5eb2c,
               (size_t)&local_c18,0x2a1,&result20,"500000 * COIN",&result21);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result23.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_14a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1498 = "";
    local_14b0 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_14a8 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    file_52.m_end = (iterator)0x2a2;
    file_52.m_begin = (iterator)&local_14a0;
    msg_52.m_end = pvVar12;
    msg_52.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_14b0,
               msg_52);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result19);
    local_be8._0_8_ = (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_bf8._0_4_ = 10;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         (pointer)local_be8._0_8_ == (pointer)0xa;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c18._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c18._M_parent =
         (_Base_ptr)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72);
    local_c40._0_8_ = local_be8;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_c40;
    local_1678._0_8_ = local_bf8;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_1678;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result23,(lazy_ostream *)&result22,1,2,REQUIRE,0xf5eb57,
               (size_t)&local_c18,0x2a2,&result20,"10U",&result21);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result23.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    CoinsResult::Clear(&available_coins);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 500000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result20,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 600000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result20,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 700000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result20,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x423883c0;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result20,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pFVar11 = &rand;
    KnapsackSolver(&result20,pvVar6,(CAmount *)&result21,1000000,pFVar11);
    local_14c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_14b8 = "";
    local_14d0 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_14c8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a2f60;
    file_53.m_end = (iterator)0x2ae;
    file_53.m_begin = (iterator)&local_14c0;
    msg_53.m_end = pvVar10;
    msg_53.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_14d0,
               msg_53);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013e29;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result20" + 8;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result23;
    local_14e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_14d8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result22,(lazy_ostream *)&result21,1,0,WARN,_cVar16,
               (size_t)&local_14e0,0x2ae);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result22.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_14f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_14e8 = "";
    local_1500 = &boost::unit_test::basic_cstring<char_const>::null;
    local_14f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_54.m_end = (iterator)0x2af;
    file_54.m_begin = (iterator)&local_14f0;
    msg_54.m_end = pvVar12;
    msg_54.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_1500,
               msg_54);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    local_bf8._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result20);
    local_c20 = (undefined1  [8])0x423883c0;
    local_c18._M_parent = (_Base_ptr)0x0;
    local_c18._M_left = (_Base_ptr)0x0;
    local_c40._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c40._M_parent =
         (_Base_ptr)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72);
    local_1678._0_8_ = local_bf8;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_1678;
    local_be8._0_8_ = local_c20;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_be8;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    local_c18._M_color._0_1_ =
         (tuple<BanMan_*,_std::default_delete<BanMan>_>)local_bf8._0_8_ ==
         (_Head_base<0UL,_BanMan_*,_false>)0x423883c0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_c18,(lazy_ostream *)&result23,1,2,REQUIRE,0xf5eb7f,
               (size_t)&local_c40,0x2af,&result21,"1111 * CENT",&result22);
    boost::detail::shared_count::~shared_count((shared_count *)&local_c18._M_left);
    local_1510 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1508 = "";
    local_1520 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_1518 = &boost::unit_test::basic_cstring<char_const>::null;
    file_55.m_end = (iterator)0x2b0;
    file_55.m_begin = (iterator)&local_1510;
    msg_55.m_end = pvVar12;
    msg_55.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_1520,
               msg_55);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result20);
    local_bf8._0_8_ = (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_c20._0_4_ = 1;
    local_c18._M_color._0_1_ =
         (tuple<BanMan_*,_std::default_delete<BanMan>_>)local_bf8._0_8_ ==
         (_Head_base<0UL,_BanMan_*,_false>)0x1;
    local_c18._M_parent = (_Base_ptr)0x0;
    local_c18._M_left = (_Base_ptr)0x0;
    local_c40._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c40._M_parent =
         (_Base_ptr)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72);
    local_1678._0_8_ = local_bf8;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_1678;
    local_be8._0_8_ = local_c20;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_be8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_c18,(lazy_ostream *)&result23,1,2,REQUIRE,0xf5eba8,
               (size_t)&local_c40,0x2b0,&result21,"1U",&result22);
    boost::detail::shared_count::~shared_count((shared_count *)&local_c18._M_left);
    CoinsResult::Clear(&available_coins);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 400000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result21,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 600000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result21,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 800000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result21,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x423883c0;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result21,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    pFVar11 = &rand;
    KnapsackSolver(&result21,pvVar6,&CENT,1000000,pFVar11);
    local_1530 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1528 = "";
    local_1540 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1538 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a34f0;
    file_56.m_end = (iterator)0x2b9;
    file_56.m_begin = (iterator)&local_1530;
    msg_56.m_end = pvVar10;
    msg_56.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_1540,
               msg_56);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c18._0_8_ = "result21";
    local_c18._M_parent = (_Base_ptr)((long)"result21" + 8);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_c18;
    local_1550 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1548 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result23,(lazy_ostream *)&result22,1,0,WARN,_cVar16,
               (size_t)&local_1550,0x2b9);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result23.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1560 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1558 = "";
    local_1570 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1568 = &boost::unit_test::basic_cstring<char_const>::null;
    file_57.m_end = (iterator)0x2ba;
    file_57.m_begin = (iterator)&local_1560;
    msg_57.m_end = pvVar12;
    msg_57.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_1570,
               msg_57);
    local_c18._M_parent = (_Base_ptr)((ulong)local_c18._M_parent & 0xffffffffffffff00);
    local_c18._0_8_ = &PTR__lazy_ostream_01388f08;
    local_c18._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c18._M_right = (_Base_ptr)((long)"\x05\x04\x03\x02\x01" + 5);
    local_c20 = (undefined1  [8])SelectionResult::GetSelectedValue((SelectionResult *)&result21);
    local_c40._M_parent = (_Base_ptr)0x0;
    local_c40._M_left = (_Base_ptr)0x0;
    local_1678._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1678._M_parent = (_Base_ptr)0xf5dffd;
    local_be8._0_8_ = local_c20;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_be8;
    local_bf8._0_8_ = &CENT;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_bf8;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    local_c40._M_color._0_1_ =
         (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)local_c20 ==
         (_Head_base<0UL,_CTxMemPool_*,_false>)0xf4240;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_c40,(lazy_ostream *)&local_c18,1,2,REQUIRE,0xf5ebd0,
               (size_t)&local_1678,0x2ba,&result22,"CENT",&result23);
    boost::detail::shared_count::~shared_count((shared_count *)((long)&local_c40 + 0x10));
    local_1580[0] =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1580[1] = "";
    local_1590._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    local_1590._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    file_58.m_end = (iterator)0x2bb;
    file_58.m_begin = (iterator)local_1580;
    msg_58.m_end = pvVar12;
    msg_58.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)local_1590,
               msg_58);
    local_c18._M_parent = (_Base_ptr)((ulong)local_c18._M_parent & 0xffffffffffffff00);
    local_c18._0_8_ = &PTR__lazy_ostream_01388f08;
    local_c18._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c18._M_right = (_Base_ptr)((long)"\x05\x04\x03\x02\x01" + 5);
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result21);
    local_c20 = (undefined1  [8])(psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_c48._0_4_ = 2;
    local_c40._M_color._0_1_ =
         (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)local_c20 ==
         (_Head_base<0UL,_CTxMemPool_*,_false>)0x2;
    local_c40._M_parent = (_Base_ptr)0x0;
    local_c40._M_left = (_Base_ptr)0x0;
    local_1678._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1678._M_parent = (_Base_ptr)0xf5dffd;
    local_be8._0_8_ = local_c20;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_be8;
    local_bf8._0_8_ = local_c48;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f88;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_bf8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_c40,(lazy_ostream *)&local_c18,1,2,REQUIRE,0xf5ebed,
               (size_t)&local_1678,699,&result22,"2U",&result23);
    boost::detail::shared_count::~shared_count((shared_count *)((long)&local_c40 + 0x10));
    CoinsResult::Clear(&available_coins);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 50000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result22,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result22,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000000;
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result22,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x5f60810;
    pFVar11 = &rand;
    KnapsackSolver(&result22,pvVar6,(CAmount *)&result23,1000000,pFVar11);
    local_15a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1598 = "";
    local_15b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_15a8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a3a50;
    file_59.m_end = (iterator)0x2c5;
    file_59.m_begin = (iterator)&local_15a0;
    msg_59.m_end = pvVar10;
    msg_59.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_15b0,
               msg_59);
    local_c18._M_color._0_1_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    local_c18._M_parent = (_Base_ptr)0x0;
    local_c18._M_left = (_Base_ptr)0x0;
    local_c40._0_8_ = "result22";
    local_c40._M_parent = (_Base_ptr)((long)"result22" + 8);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_c40;
    local_15c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_15b8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_c18,(lazy_ostream *)&result23,1,0,WARN,_cVar16,
               (size_t)&local_15c0,0x2c5);
    boost::detail::shared_count::~shared_count((shared_count *)&local_c18._M_left);
    local_15e8._24_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_15e8._32_8_ = "";
    local_15e8._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    local_15e8._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    file_60.m_end = (iterator)0x2c6;
    file_60.m_begin = local_15e8 + 0x18;
    msg_60.m_end = pvVar12;
    msg_60.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,
               (size_t)(local_15e8 + 8),msg_60);
    local_c40._M_parent = (_Base_ptr)((ulong)local_c40._M_parent & 0xffffffffffffff00);
    local_c40._0_8_ = &PTR__lazy_ostream_01388f08;
    local_c40._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c40._M_right = (_Base_ptr)0xf4aea1;
    local_c48 = (undefined1  [8])SelectionResult::GetSelectedValue((SelectionResult *)&result22);
    local_15e8._0_8_ = 0x605e690;
    local_1678._M_parent = (_Base_ptr)0x0;
    local_1678._M_left = (_Base_ptr)0x0;
    local_be8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_be8._8_8_ = "";
    local_bf8._0_8_ = local_c48;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013892a8;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_bf8;
    local_c20 = (undefined1  [8])local_15e8;
    local_c18._M_parent = (_Base_ptr)((ulong)local_c18._M_parent & 0xffffffffffffff00);
    local_c18._0_8_ = &PTR__lazy_ostream_013892a8;
    local_c18._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c18._M_right = (_Base_ptr)local_c20;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    local_1678._M_color._0_1_ =
         (tuple<ECC_Context_*,_std::default_delete<ECC_Context>_>)local_c48 ==
         (_Head_base<0UL,_ECC_Context_*,_false>)0x605e690;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1678,(lazy_ostream *)&local_c40,1,2,REQUIRE,0xf5ec15,
               (size_t)local_be8,0x2c6,&result23,"CENT * 10105 / 100",
               (__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                *)&local_c18);
    boost::detail::shared_count::~shared_count((shared_count *)&local_1678._M_left);
    local_15f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_15f0 = "";
    local_1608 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1600 = &boost::unit_test::basic_cstring<char_const>::null;
    file_61.m_end = (iterator)0x2c7;
    file_61.m_begin = (iterator)&local_15f8;
    msg_61.m_end = pvVar12;
    msg_61.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_1608,
               msg_61);
    local_c40._M_parent = (_Base_ptr)((ulong)local_c40._M_parent & 0xffffffffffffff00);
    local_c40._0_8_ = &PTR__lazy_ostream_01388f08;
    local_c40._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c40._M_right = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result22);
    local_c48 = (undefined1  [8])(psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_15e8._0_4_ = (__atomic_base<unsigned_int>)0x3;
    local_1678._M_color._0_1_ =
         (tuple<ECC_Context_*,_std::default_delete<ECC_Context>_>)local_c48 ==
         (_Head_base<0UL,_ECC_Context_*,_false>)0x3;
    local_1678._M_parent = (_Base_ptr)0x0;
    local_1678._M_left = (_Base_ptr)0x0;
    local_be8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_be8._8_8_ = "";
    local_bf8._0_8_ = local_c48;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f48;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_bf8;
    local_c20 = (undefined1  [8])local_15e8;
    local_c18._M_parent = (_Base_ptr)((ulong)local_c18._M_parent & 0xffffffffffffff00);
    local_c18._0_8_ = &PTR__lazy_ostream_01388f88;
    local_c18._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c18._M_right = (_Base_ptr)local_c20;
    pvVar10 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1678,(lazy_ostream *)&local_c40,1,2,REQUIRE,0xf5ec45,
               (size_t)local_be8,0x2c7,&result23,"3U",
               (__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                *)&local_c18);
    boost::detail::shared_count::~shared_count((shared_count *)&local_1678._M_left);
    pvVar6 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    local_c18._0_8_ =
         (__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>)
         0x5f45a60;
    pFVar11 = &rand;
    KnapsackSolver(&result23,pvVar6,(CAmount *)&local_c18,1000000,pFVar11);
    local_1618 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1610 = "";
    local_1628 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1620 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a3f1c;
    file_62.m_end = (iterator)0x2cb;
    file_62.m_begin = (iterator)&local_1618;
    msg_62.m_end = pvVar10;
    msg_62.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_1628,
               msg_62);
    local_c40._M_color._0_1_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    local_c40._M_parent = (_Base_ptr)0x0;
    local_c40._M_left = (_Base_ptr)0x0;
    local_1678._0_8_ = "result23";
    local_1678._M_parent = (_Base_ptr)0xf5ec6c;
    local_c18._M_parent = (_Base_ptr)((ulong)local_c18._M_parent & 0xffffffffffffff00);
    local_c18._0_8_ = &PTR__lazy_ostream_01389048;
    local_c18._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c18._M_right = &local_1678;
    local_1638 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1630 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_c40,(lazy_ostream *)&local_c18,1,0,WARN,_cVar16,
               (size_t)&local_1638,0x2cb);
    boost::detail::shared_count::~shared_count((shared_count *)((long)&local_c40 + 0x10));
    local_1648 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1640 = "";
    local_1658 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1650 = &boost::unit_test::basic_cstring<char_const>::null;
    file_63.m_end = (iterator)0x2cc;
    file_63.m_begin = (iterator)&local_1648;
    msg_63.m_end = pvVar12;
    msg_63.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_1658,
               msg_63);
    local_1678._M_parent = (_Base_ptr)((ulong)local_1678._M_parent & 0xffffffffffffff00);
    local_1678._0_8_ = &PTR__lazy_ostream_01388f08;
    local_1678._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_1678._M_right = (_Base_ptr)0xf4aea1;
    local_15e8._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result23);
    local_1680 = 101000000;
    local_be8._8_8_ = (element_type *)0x0;
    local_be8._16_8_ = (_Base_ptr)0x0;
    local_bf8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_bf8._8_8_ = "";
    local_c20 = (undefined1  [8])local_15e8;
    local_c18._M_parent = (_Base_ptr)((ulong)local_c18._M_parent & 0xffffffffffffff00);
    local_c18._0_8_ = &PTR__lazy_ostream_013892a8;
    local_c18._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c18._M_right = (_Base_ptr)local_c20;
    local_c48 = (undefined1  [8])&local_1680;
    local_c40._M_parent = (_Base_ptr)((ulong)local_c40._M_parent & 0xffffffffffffff00);
    local_c40._0_8_ = &PTR__lazy_ostream_013892a8;
    local_c40._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c40._M_right = (_Base_ptr)local_c48;
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    local_be8[0] = (class_property<bool>)(class_property<bool>)(local_15e8._0_8_ == 101000000);
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_be8,(lazy_ostream *)&local_1678,1,2,REQUIRE,0xf5ec6d,
               (size_t)local_bf8,0x2cc,
               (__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                *)&local_c18,"101 * CENT",&local_c40);
    boost::detail::shared_count::~shared_count((shared_count *)(local_be8 + 0x10));
    local_1690 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1688 = "";
    local_16a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1698 = &boost::unit_test::basic_cstring<char_const>::null;
    file_64.m_end = (iterator)0x2cd;
    file_64.m_begin = (iterator)&local_1690;
    msg_64.m_end = pvVar12;
    msg_64.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_16a0,
               msg_64);
    local_1678._M_parent = (_Base_ptr)((ulong)local_1678._M_parent & 0xffffffffffffff00);
    local_1678._0_8_ = &PTR__lazy_ostream_01388f08;
    local_1678._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_1678._M_right = (_Base_ptr)0xf4aea1;
    psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result23);
    local_15e8._0_8_ = (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_1680 = CONCAT44(local_1680._4_4_,2);
    local_be8[0] = (class_property<bool>)(class_property<bool>)(local_15e8._0_8_ == 2);
    local_be8._8_8_ = (element_type *)0x0;
    local_be8._16_8_ = (_Base_ptr)0x0;
    local_bf8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_bf8._8_8_ = "";
    local_c20 = (undefined1  [8])local_15e8;
    local_c18._M_parent = (_Base_ptr)((ulong)local_c18._M_parent & 0xffffffffffffff00);
    local_c18._0_8_ = &PTR__lazy_ostream_01388f48;
    local_c18._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c18._M_right = (_Base_ptr)local_c20;
    local_c48 = (undefined1  [8])&local_1680;
    local_c40._M_parent = (_Base_ptr)((ulong)local_c40._M_parent & 0xffffffffffffff00);
    local_c40._0_8_ = &PTR__lazy_ostream_01388f88;
    local_c40._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_c40._M_right = (_Base_ptr)local_c48;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_be8,(lazy_ostream *)&local_1678,1,2,REQUIRE,0xf5ec95,
               (size_t)local_bf8,0x2cd,
               (__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                *)&local_c18,"2U",&local_c40);
    boost::detail::shared_count::~shared_count((shared_count *)(local_be8 + 0x10));
    if (result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result23);
    }
    if (result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result22);
    }
    if (result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result21);
    }
    if (result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result20);
    }
    if (result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result19);
    }
    if (result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result18);
    }
    if (result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result17);
    }
    if (result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result16);
    }
    if (result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result15);
    }
    if (result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result14);
    }
    if (result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result13);
    }
    if (result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result12);
    }
    if (result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result11);
    }
    if (result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result10);
    }
    if (result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result9);
    }
    if (result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result8);
    }
    if (result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result7);
    }
    if (result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result6);
    }
    if (result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result5);
    }
    if (result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result4);
    }
    if (result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result3);
    }
    if (result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result2);
    }
    if (result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result1);
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != 100);
  result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x5dc;
  do {
    CoinsResult::Clear(&available_coins);
    sVar13 = 0x2a4;
    do {
      pvVar10 = (iterator)0x0;
      add_coin(&available_coins,
               (CWallet *)
               wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
               (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
      sVar13 = sVar13 + -1;
    } while (sVar13 != 0);
    iVar14 = 100;
    do {
      pvVar6 = KnapsackGroupOutputs
                         (&available_coins,
                          (CWallet *)
                          wallet._M_t.
                          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                          .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                          (CoinEligibilityFilter *)filter_confirmed);
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 2000;
      pFVar11 = &rand;
      KnapsackSolver(&result1,pvVar6,(CAmount *)&result2,1000000,pFVar11);
      local_16b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_16a8 = "";
      local_16c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_16b8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar16 = 0x7a472d;
      file_65.m_end = (iterator)0x2da;
      file_65.m_begin = (iterator)&local_16b0;
      msg_65.m_end = pvVar10;
      msg_65.m_begin = (iterator)pFVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_16c0,
                 msg_65);
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_2013efa;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result24" + 8;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_01389048;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
      local_16d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_16c8 = "";
      pvVar10 = (iterator)0x1;
      pvVar12 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar16,
                 (size_t)&local_16d0,0x2da);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      uVar4 = result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
              super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
              super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_;
      if ((long)result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ < 0xf4a10) {
        dVar15 = ceil(1002000.0 /
                      (double)(long)result9.
                                    super__Optional_base<wallet::SelectionResult,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>
                                    .super__Optional_payload_base<wallet::SelectionResult>.
                                    _M_payload._0_8_);
        result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_2_ = (short)(int)dVar15;
        result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             (ulong)((int)dVar15 & 0xffff) * uVar4;
        local_16e0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_16d8 = "";
        local_16f0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_16e8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_66.m_end = (iterator)0x2e0;
        file_66.m_begin = (iterator)&local_16e0;
        msg_66.m_end = pvVar12;
        msg_66.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,
                   (size_t)&local_16f0,msg_66);
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
             0xffffffffffffff00;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01388f08;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
        result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             SelectionResult::GetSelectedValue((SelectionResult *)&result1);
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
             result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ ==
             result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             anon_var_dwarf_2013749;
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             + 0x72;
        result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result11;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_013892a8;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
        result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result10;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
             0xffffffffffffff00;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_013892a8;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
        pvVar10 = (iterator)0x1;
        pvVar12 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&result5,(lazy_ostream *)&result4,1,2,REQUIRE,0xf5ecbd,
                   (size_t)&result6,0x2e0,&result2,"returnValue",&result3);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                           super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value
                           .m_selected_inputs + 0x10));
        local_1700 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_16f8 = "";
        local_1710 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1708 = &boost::unit_test::basic_cstring<char_const>::null;
        file_67.m_end = (iterator)0x2e1;
        file_67.m_begin = (iterator)&local_1700;
        msg_67.m_end = pvVar12;
        msg_67.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,
                   (size_t)&local_1710,msg_67);
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
             0xffffffffffffff00;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01388f08;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
        psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result1);
        result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
             result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ ==
             (result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
              super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
              super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ & 0xffff);
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             anon_var_dwarf_2013749;
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             + 0x72;
        result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result11;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01388f48;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
        result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result12;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
             0xffffffffffffff00;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01389bb8;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
        pvVar10 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&result5,(lazy_ostream *)&result4,1,2,REQUIRE,0xf5ece6,
                   (size_t)&result6,0x2e1,&result2,"returnSize",&result3);
      }
      else {
        local_1720 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_1718 = "";
        local_1730 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1728 = &boost::unit_test::basic_cstring<char_const>::null;
        file_68.m_end = (iterator)0x2e4;
        file_68.m_begin = (iterator)&local_1720;
        msg_68.m_end = pvVar12;
        msg_68.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,
                   (size_t)&local_1730,msg_68);
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
             0xffffffffffffff00;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01388f08;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
        result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             SelectionResult::GetSelectedValue((SelectionResult *)&result1);
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
             result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ ==
             result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             anon_var_dwarf_2013749;
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             + 0x72;
        result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result10;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_013892a8;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
        result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result9;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
             0xffffffffffffff00;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_013892a8;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
        pvVar10 = (iterator)0x1;
        pvVar12 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&result5,(lazy_ostream *)&result4,1,2,REQUIRE,0xf5ecbd,
                   (size_t)&result6,0x2e4,&result2,"amt",&result3);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                           super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value
                           .m_selected_inputs + 0x10));
        local_1740 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_1738 = "";
        local_1750 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1748 = &boost::unit_test::basic_cstring<char_const>::null;
        file_69.m_end = (iterator)0x2e5;
        file_69.m_begin = (iterator)&local_1740;
        msg_69.m_end = pvVar12;
        msg_69.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,
                   (size_t)&local_1750,msg_69);
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
             0xffffffffffffff00;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01388f08;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
        psVar7 = SelectionResult::GetInputSet((SelectionResult *)&result1);
        result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
             result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ == 1;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
        result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             anon_var_dwarf_2013749;
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             + 0x72;
        result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result10;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01388f48;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
        result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result11;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
             result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
             0xffffffffffffff00;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01388f88;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
        pvVar10 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&result5,(lazy_ostream *)&result4,1,2,REQUIRE,0xf5ece6,
                   (size_t)&result6,0x2e5,&result2,"1U",&result3);
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      if (result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
          super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
          super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
        result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)&result1);
      }
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    lVar3 = result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
            super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
            super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ * 10;
    bVar5 = (long)result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ < 10000000;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = lVar3;
  } while (bVar5);
  CoinsResult::Clear(&available_coins);
  iVar14 = 100;
  do {
    pvVar10 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&COIN,(CFeeRate)0x0,0x90,
             false,0,false,in_stack_ffffffffffffe718);
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  iVar14 = 0;
  do {
    CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2,
                     &available_coins);
    pvVar6 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2,false)
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000000;
    pFVar11 = &rand;
    KnapsackSolver(&result1,pvVar6,(CAmount *)&result3,1000000,pFVar11);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2);
    local_1760 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1758 = "";
    local_1770 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1768 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a507f;
    file_70.m_end = (iterator)0x2f5;
    file_70.m_begin = (iterator)&local_1760;
    msg_70.m_end = pvVar10;
    msg_70.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_1770,
               msg_70);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013f48;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result25" + 8;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
    local_1780 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1778 = "";
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar16,
               (size_t)&local_1780,0x2f5);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3,
                     &available_coins);
    pvVar6 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3,false)
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000000;
    pFVar11 = &rand;
    KnapsackSolver(&result2,pvVar6,(CAmount *)&result4,1000000,pFVar11);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3);
    local_1790 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1788 = "";
    local_17a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1798 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar16 = 0x7a51d7;
    file_71.m_end = (iterator)0x2f7;
    file_71.m_begin = (iterator)&local_1790;
    msg_71.m_end = pvVar10;
    msg_71.m_begin = (iterator)pFVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_17a0,
               msg_71);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013f55;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result26" + 8;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
    local_17b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_17a8 = "";
    pvVar10 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar16,
               (size_t)&local_17b0,0x2f7);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_17c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_17b8 = "";
    local_17d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_17c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_72.m_end = (iterator)0x2f8;
    file_72.m_begin = (iterator)&local_17c0;
    msg_72.m_end = pvVar12;
    msg_72.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_17d0,
               msg_72);
    _cVar16 = 0x7a52e9;
    bVar5 = EqualResult((SelectionResult *)&result1,(SelectionResult *)&result2);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ = !bVar5;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013f62;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)"!EqualResult(*result25, *result26)" + 0x22;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01389048;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
    local_17e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_17d8 = "";
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar16,
               (size_t)&local_17e0,0x2f8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ & 0xffffffff00000000
    ;
    iVar9 = 5;
    do {
      CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result4,
                       &available_coins);
      pvVar6 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result4,
                          false);
      pFVar11 = &rand;
      KnapsackSolver(&result3,pvVar6,&COIN,1000000,pFVar11);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result4);
      local_17f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_17e8 = "";
      local_1800 = &boost::unit_test::basic_cstring<char_const>::null;
      local_17f8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar16 = 0x7a5454;
      file_73.m_end = (iterator)0x302;
      file_73.m_begin = (iterator)&local_17f0;
      msg_73.m_end = pvVar10;
      msg_73.m_begin = (iterator)pFVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_1800,
                 msg_73);
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_2013f7d;
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result27" + 8;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
           result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
           0xffffffffffffff00;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_01389048;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
      local_1810 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1808 = "";
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result5,(lazy_ostream *)&result4,1,0,WARN,_cVar16,
                 (size_t)&local_1810,0x302);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result5,
                       &available_coins);
      pvVar6 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result5,
                          false);
      pFVar11 = &rand;
      KnapsackSolver(&result4,pvVar6,&COIN,1000000,pFVar11);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result5);
      local_1820 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1818 = "";
      local_1830 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1828 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar16 = 0x7a55b5;
      file_74.m_end = (iterator)0x304;
      file_74.m_begin = (iterator)&local_1820;
      msg_74.m_end = pvVar10;
      msg_74.m_begin = (iterator)pFVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_1830,
                 msg_74);
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_2013f8a;
      result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result28" + 8;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
           result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
           0xffffffffffffff00;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_01389048;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
      local_1840 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1838 = "";
      pvVar12 = (iterator)0x1;
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result6,(lazy_ostream *)&result5,1,0,WARN,_cVar16,
                 (size_t)&local_1840,0x304);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result6.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      bVar5 = EqualResult((SelectionResult *)&result3,(SelectionResult *)&result4);
      if (bVar5) {
        result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ =
             result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ + 1;
      }
      if (result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
          super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
          super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)&result4);
      }
      if (result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
          super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
          super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)&result3);
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    local_1850 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1848 = "";
    local_1860 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1858 = &boost::unit_test::basic_cstring<char_const>::null;
    file_75.m_end = (iterator)0x308;
    file_75.m_begin = (iterator)&local_1850;
    msg_75.m_end = pvVar10;
    msg_75.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_1860,
               msg_75);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 5;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ == 5;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ != 5;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result10;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013890c8;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result11;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013890c8;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result9;
    pvVar10 = (iterator)0x3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result6,(lazy_ostream *)&result5,1,3,REQUIRE,0xe49d2a,
               (size_t)&result7,0x308,(SelectionResult *)&result3,"5",&result4);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result6.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    if (result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result2);
    }
    if (result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
      result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result1);
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != 100);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 10000000;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
       (long)
       "5468697320697320612074657374207573696e672061206c6172676572207468616e20626c6f636b2d73697a65206b657920616e642061206c6172676572207468616e20626c6f636b2d73697a6520646174612e20546865206b6579206e6565647320746f20626520686173686564206265666f7265206265696e6720757365642062792074686520484d414320616c676f726974686d2e"
       + 0x8f;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 20000000;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 25000000;
  pvVar10 = (iterator)0x0;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe718);
  iVar14 = 0;
  do {
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ & 0xffffffff00000000
    ;
    iVar9 = 5;
    do {
      CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2,
                       &available_coins);
      pvVar6 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2,
                          false);
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 90000000;
      pFVar11 = &rand;
      KnapsackSolver(&result1,pvVar6,(CAmount *)&result3,1000000,pFVar11);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2);
      local_1870 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1868 = "";
      local_1880 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1878 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar16 = 0x7a5aad;
      file_76.m_end = (iterator)0x319;
      file_76.m_begin = (iterator)&local_1870;
      msg_76.m_end = pvVar10;
      msg_76.m_begin = (iterator)pFVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_1880,
                 msg_76);
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_2013fbf;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result29" + 8;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_01389048;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
      local_1890 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1888 = "";
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar16,
                 (size_t)&local_1890,0x319);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3,
                       &available_coins);
      pvVar6 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3,
                          false);
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 90000000;
      pFVar11 = &rand;
      KnapsackSolver(&result2,pvVar6,(CAmount *)&result4,1000000,pFVar11);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3);
      local_18a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1898 = "";
      local_18b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_18a8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar16 = 0x7a5bee;
      file_77.m_end = (iterator)0x31b;
      file_77.m_begin = (iterator)&local_18a0;
      msg_77.m_end = pvVar10;
      msg_77.m_begin = (iterator)pFVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_18b0,
                 msg_77);
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_2013fcc;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result30" + 8;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
           result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
           0xffffffffffffff00;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_01389048;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
      local_18c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_18b8 = "";
      pvVar12 = (iterator)0x1;
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar16,
                 (size_t)&local_18c0,0x31b);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      bVar5 = EqualResult((SelectionResult *)&result1,(SelectionResult *)&result2);
      if (bVar5) {
        result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ =
             result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ + 1;
      }
      if (result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
          super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
          super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)&result2);
      }
      if (result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
          super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
          super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
        result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)&result1);
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    local_18d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_18c8 = "";
    local_18e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_18d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_78.m_end = (iterator)0x31f;
    file_78.m_begin = (iterator)&local_18d0;
    msg_78.m_end = pvVar10;
    msg_78.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_78,(size_t)&local_18e0,
               msg_78);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01388f08;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 5;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ == 5;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ != 5;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result1.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_2013749;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result8;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013890c8;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = &result9;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_013890c8;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
    pvVar10 = (iterator)0x3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,3,REQUIRE,0xe49d2a,
               (size_t)&result5,799,(SelectionResult *)&result1,"5",(SelectionResult *)&result2);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    iVar14 = iVar14 + 1;
  } while (iVar14 != 100);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  ChaCha20::~ChaCha20(&rand.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(knapsack_solver_test)
{
    FastRandomContext rand{};
    const auto temp1{[&rand](std::vector<OutputGroup>& g, const CAmount& v, CAmount c) { return KnapsackSolver(g, v, c, rand); }};
    const auto KnapsackSolver{temp1};
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;

    // test multiple times to allow for differences in the shuffle order
    for (int i = 0; i < RUN_TESTS; i++)
    {
        available_coins.Clear();

        // with an empty wallet we can't even pay one cent
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT));

        add_coin(available_coins, *wallet, 1*CENT, CFeeRate(0), 4);        // add a new 1 cent coin

        // with a new 1 cent coin, we still can't find a mature 1 cent
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT));

        // but we can find a new 1 cent
        const auto result1 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result1);
        BOOST_CHECK_EQUAL(result1->GetSelectedValue(), 1 * CENT);

        add_coin(available_coins, *wallet, 2*CENT);           // add a mature 2 cent coin

        // we can't make 3 cents of mature coins
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 3 * CENT, CENT));

        // we can make 3 cents of new coins
        const auto result2 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 3 * CENT, CENT);
        BOOST_CHECK(result2);
        BOOST_CHECK_EQUAL(result2->GetSelectedValue(), 3 * CENT);

        add_coin(available_coins, *wallet, 5*CENT);           // add a mature 5 cent coin,
        add_coin(available_coins, *wallet, 10*CENT, CFeeRate(0), 3, true); // a new 10 cent coin sent from one of our own addresses
        add_coin(available_coins, *wallet, 20*CENT);          // and a mature 20 cent coin

        // now we have new: 1+10=11 (of which 10 was self-sent), and mature: 2+5+20=27.  total = 38

        // we can't make 38 cents only if we disallow new coins:
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 38 * CENT, CENT));
        // we can't even make 37 cents if we don't allow new coins even if they're from us
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard_extra), 38 * CENT, CENT));
        // but we can make 37 cents if we accept new coins from ourself
        const auto result3 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 37 * CENT, CENT);
        BOOST_CHECK(result3);
        BOOST_CHECK_EQUAL(result3->GetSelectedValue(), 37 * CENT);
        // and we can make 38 cents if we accept all new coins
        const auto result4 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 38 * CENT, CENT);
        BOOST_CHECK(result4);
        BOOST_CHECK_EQUAL(result4->GetSelectedValue(), 38 * CENT);

        // try making 34 cents from 1,2,5,10,20 - we can't do it exactly
        const auto result5 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 34 * CENT, CENT);
        BOOST_CHECK(result5);
        BOOST_CHECK_EQUAL(result5->GetSelectedValue(), 35 * CENT);       // but 35 cents is closest
        BOOST_CHECK_EQUAL(result5->GetInputSet().size(), 3U);     // the best should be 20+10+5.  it's incredibly unlikely the 1 or 2 got included (but possible)

        // when we try making 7 cents, the smaller coins (1,2,5) are enough.  We should see just 2+5
        const auto result6 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 7 * CENT, CENT);
        BOOST_CHECK(result6);
        BOOST_CHECK_EQUAL(result6->GetSelectedValue(), 7 * CENT);
        BOOST_CHECK_EQUAL(result6->GetInputSet().size(), 2U);

        // when we try making 8 cents, the smaller coins (1,2,5) are exactly enough.
        const auto result7 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 8 * CENT, CENT);
        BOOST_CHECK(result7);
        BOOST_CHECK(result7->GetSelectedValue() == 8 * CENT);
        BOOST_CHECK_EQUAL(result7->GetInputSet().size(), 3U);

        // when we try making 9 cents, no subset of smaller coins is enough, and we get the next bigger coin (10)
        const auto result8 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 9 * CENT, CENT);
        BOOST_CHECK(result8);
        BOOST_CHECK_EQUAL(result8->GetSelectedValue(), 10 * CENT);
        BOOST_CHECK_EQUAL(result8->GetInputSet().size(), 1U);

        // now clear out the wallet and start again to test choosing between subsets of smaller coins and the next biggest coin
        available_coins.Clear();

        add_coin(available_coins, *wallet,  6*CENT);
        add_coin(available_coins, *wallet,  7*CENT);
        add_coin(available_coins, *wallet,  8*CENT);
        add_coin(available_coins, *wallet, 20*CENT);
        add_coin(available_coins, *wallet, 30*CENT); // now we have 6+7+8+20+30 = 71 cents total

        // check that we have 71 and not 72
        const auto result9 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 71 * CENT, CENT);
        BOOST_CHECK(result9);
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 72 * CENT, CENT));

        // now try making 16 cents.  the best smaller coins can do is 6+7+8 = 21; not as good at the next biggest coin, 20
        const auto result10 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result10);
        BOOST_CHECK_EQUAL(result10->GetSelectedValue(), 20 * CENT); // we should get 20 in one coin
        BOOST_CHECK_EQUAL(result10->GetInputSet().size(), 1U);

        add_coin(available_coins, *wallet,  5*CENT); // now we have 5+6+7+8+20+30 = 75 cents total

        // now if we try making 16 cents again, the smaller coins can make 5+6+7 = 18 cents, better than the next biggest coin, 20
        const auto result11 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result11);
        BOOST_CHECK_EQUAL(result11->GetSelectedValue(), 18 * CENT); // we should get 18 in 3 coins
        BOOST_CHECK_EQUAL(result11->GetInputSet().size(), 3U);

        add_coin(available_coins, *wallet,  18*CENT); // now we have 5+6+7+8+18+20+30

        // and now if we try making 16 cents again, the smaller coins can make 5+6+7 = 18 cents, the same as the next biggest coin, 18
        const auto result12 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result12);
        BOOST_CHECK_EQUAL(result12->GetSelectedValue(), 18 * CENT);  // we should get 18 in 1 coin
        BOOST_CHECK_EQUAL(result12->GetInputSet().size(), 1U); // because in the event of a tie, the biggest coin wins

        // now try making 11 cents.  we should get 5+6
        const auto result13 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 11 * CENT, CENT);
        BOOST_CHECK(result13);
        BOOST_CHECK_EQUAL(result13->GetSelectedValue(), 11 * CENT);
        BOOST_CHECK_EQUAL(result13->GetInputSet().size(), 2U);

        // check that the smallest bigger coin is used
        add_coin(available_coins, *wallet,  1*COIN);
        add_coin(available_coins, *wallet,  2*COIN);
        add_coin(available_coins, *wallet,  3*COIN);
        add_coin(available_coins, *wallet,  4*COIN); // now we have 5+6+7+8+18+20+30+100+200+300+400 = 1094 cents
        const auto result14 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 95 * CENT, CENT);
        BOOST_CHECK(result14);
        BOOST_CHECK_EQUAL(result14->GetSelectedValue(), 1 * COIN);  // we should get 1 BTC in 1 coin
        BOOST_CHECK_EQUAL(result14->GetInputSet().size(), 1U);

        const auto result15 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 195 * CENT, CENT);
        BOOST_CHECK(result15);
        BOOST_CHECK_EQUAL(result15->GetSelectedValue(), 2 * COIN);  // we should get 2 BTC in 1 coin
        BOOST_CHECK_EQUAL(result15->GetInputSet().size(), 1U);

        // empty the wallet and start again, now with fractions of a cent, to test small change avoidance

        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 1 / 10);
        add_coin(available_coins, *wallet, CENT * 2 / 10);
        add_coin(available_coins, *wallet, CENT * 3 / 10);
        add_coin(available_coins, *wallet, CENT * 4 / 10);
        add_coin(available_coins, *wallet, CENT * 5 / 10);

        // try making 1 * CENT from the 1.5 * CENT
        // we'll get change smaller than CENT whatever happens, so can expect CENT exactly
        const auto result16 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT, CENT);
        BOOST_CHECK(result16);
        BOOST_CHECK_EQUAL(result16->GetSelectedValue(), CENT);

        // but if we add a bigger coin, small change is avoided
        add_coin(available_coins, *wallet, 1111*CENT);

        // try making 1 from 0.1 + 0.2 + 0.3 + 0.4 + 0.5 + 1111 = 1112.5
        const auto result17 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result17);
        BOOST_CHECK_EQUAL(result17->GetSelectedValue(), 1 * CENT); // we should get the exact amount

        // if we add more small coins:
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 7 / 10);

        // and try again to make 1.0 * CENT
        const auto result18 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result18);
        BOOST_CHECK_EQUAL(result18->GetSelectedValue(), 1 * CENT); // we should get the exact amount

        // run the 'mtgox' test (see https://blockexplorer.com/tx/29a3efd3ef04f9153d47a990bd7b048a4b2d213daaa5fb8ed670fb85f13bdbcf)
        // they tried to consolidate 10 50k coins into one 500k coin, and ended up with 50k in change
        available_coins.Clear();
        for (int j = 0; j < 20; j++)
            add_coin(available_coins, *wallet, 50000 * COIN);

        const auto result19 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 500000 * COIN, CENT);
        BOOST_CHECK(result19);
        BOOST_CHECK_EQUAL(result19->GetSelectedValue(), 500000 * COIN); // we should get the exact amount
        BOOST_CHECK_EQUAL(result19->GetInputSet().size(), 10U); // in ten coins

        // if there's not enough in the smaller coins to make at least 1 * CENT change (0.5+0.6+0.7 < 1.0+1.0),
        // we need to try finding an exact subset anyway

        // sometimes it will fail, and so we use the next biggest coin:
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 5 / 10);
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 7 / 10);
        add_coin(available_coins, *wallet, 1111 * CENT);
        const auto result20 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result20);
        BOOST_CHECK_EQUAL(result20->GetSelectedValue(), 1111 * CENT); // we get the bigger coin
        BOOST_CHECK_EQUAL(result20->GetInputSet().size(), 1U);

        // but sometimes it's possible, and we use an exact subset (0.4 + 0.6 = 1.0)
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 4 / 10);
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 8 / 10);
        add_coin(available_coins, *wallet, 1111 * CENT);
        const auto result21 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT, CENT);
        BOOST_CHECK(result21);
        BOOST_CHECK_EQUAL(result21->GetSelectedValue(), CENT);   // we should get the exact amount
        BOOST_CHECK_EQUAL(result21->GetInputSet().size(), 2U); // in two coins 0.4+0.6

        // test avoiding small change
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 5 / 100);
        add_coin(available_coins, *wallet, CENT * 1);
        add_coin(available_coins, *wallet, CENT * 100);

        // trying to make 100.01 from these three coins
        const auto result22 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT * 10001 / 100, CENT);
        BOOST_CHECK(result22);
        BOOST_CHECK_EQUAL(result22->GetSelectedValue(), CENT * 10105 / 100); // we should get all coins
        BOOST_CHECK_EQUAL(result22->GetInputSet().size(), 3U);

        // but if we try to make 99.9, we should take the bigger of the two small coins to avoid small change
        const auto result23 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT * 9990 / 100, CENT);
        BOOST_CHECK(result23);
        BOOST_CHECK_EQUAL(result23->GetSelectedValue(), 101 * CENT);
        BOOST_CHECK_EQUAL(result23->GetInputSet().size(), 2U);
    }

    // test with many inputs
    for (CAmount amt=1500; amt < COIN; amt*=10) {
        available_coins.Clear();
        // Create 676 inputs (=  (old MAX_STANDARD_TX_SIZE == 100000)  / 148 bytes per input)
        for (uint16_t j = 0; j < 676; j++)
            add_coin(available_coins, *wallet, amt);

        // We only create the wallet once to save time, but we still run the coin selection RUN_TESTS times.
        for (int i = 0; i < RUN_TESTS; i++) {
            const auto result24 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 2000, CENT);
            BOOST_CHECK(result24);

            if (amt - 2000 < CENT) {
                // needs more than one input:
                uint16_t returnSize = std::ceil((2000.0 + CENT)/amt);
                CAmount returnValue = amt * returnSize;
                BOOST_CHECK_EQUAL(result24->GetSelectedValue(), returnValue);
                BOOST_CHECK_EQUAL(result24->GetInputSet().size(), returnSize);
            } else {
                // one input is sufficient:
                BOOST_CHECK_EQUAL(result24->GetSelectedValue(), amt);
                BOOST_CHECK_EQUAL(result24->GetInputSet().size(), 1U);
            }
        }
    }

    // test randomness
    {
        available_coins.Clear();
        for (int i2 = 0; i2 < 100; i2++)
            add_coin(available_coins, *wallet, COIN);

        // Again, we only create the wallet once to save time, but we still run the coin selection RUN_TESTS times.
        for (int i = 0; i < RUN_TESTS; i++) {
            // picking 50 from 100 coins doesn't depend on the shuffle,
            // but does depend on randomness in the stochastic approximation code
            const auto result25 = KnapsackSolver(GroupCoins(available_coins.All()), 50 * COIN, CENT);
            BOOST_CHECK(result25);
            const auto result26 = KnapsackSolver(GroupCoins(available_coins.All()), 50 * COIN, CENT);
            BOOST_CHECK(result26);
            BOOST_CHECK(!EqualResult(*result25, *result26));

            int fails = 0;
            for (int j = 0; j < RANDOM_REPEATS; j++)
            {
                // Test that the KnapsackSolver selects randomly from equivalent coins (same value and same input size).
                // When choosing 1 from 100 identical coins, 1% of the time, this test will choose the same coin twice
                // which will cause it to fail.
                // To avoid that issue, run the test RANDOM_REPEATS times and only complain if all of them fail
                const auto result27 = KnapsackSolver(GroupCoins(available_coins.All()), COIN, CENT);
                BOOST_CHECK(result27);
                const auto result28 = KnapsackSolver(GroupCoins(available_coins.All()), COIN, CENT);
                BOOST_CHECK(result28);
                if (EqualResult(*result27, *result28))
                    fails++;
            }
            BOOST_CHECK_NE(fails, RANDOM_REPEATS);
        }

        // add 75 cents in small change.  not enough to make 90 cents,
        // then try making 90 cents.  there are multiple competing "smallest bigger" coins,
        // one of which should be picked at random
        add_coin(available_coins, *wallet, 5 * CENT);
        add_coin(available_coins, *wallet, 10 * CENT);
        add_coin(available_coins, *wallet, 15 * CENT);
        add_coin(available_coins, *wallet, 20 * CENT);
        add_coin(available_coins, *wallet, 25 * CENT);

        for (int i = 0; i < RUN_TESTS; i++) {
            int fails = 0;
            for (int j = 0; j < RANDOM_REPEATS; j++)
            {
                const auto result29 = KnapsackSolver(GroupCoins(available_coins.All()), 90 * CENT, CENT);
                BOOST_CHECK(result29);
                const auto result30 = KnapsackSolver(GroupCoins(available_coins.All()), 90 * CENT, CENT);
                BOOST_CHECK(result30);
                if (EqualResult(*result29, *result30))
                    fails++;
            }
            BOOST_CHECK_NE(fails, RANDOM_REPEATS);
        }
    }
}